

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

uint8_t * __thiscall pstore::storage::address_to_raw_pointer(storage *this,address addr)

{
  uchar *puVar1;
  storage *this_local;
  address addr_local;
  
  puVar1 = address_to_raw_pointer_impl<pstore::storage_const,unsigned_char_const*>(this,addr);
  return puVar1;
}

Assistant:

std::uint8_t const * address_to_raw_pointer (address const addr) const noexcept {
            return address_to_raw_pointer_impl (*this, addr);
        }